

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O3

void __thiscall CNet::Refine(CNet *this)

{
  pointer ppCVar1;
  CWire *pCVar2;
  _Hashtable_node<std::pair<const_long_long,_int>_> *p_Var3;
  int iVar4;
  int iVar5;
  reference pvVar6;
  _Hashtable_node<std::pair<const_long_long,_int>_> *p_Var7;
  pointer ppCVar8;
  pointer pp_Var9;
  ulong uVar10;
  pointer pp_Var11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
  RedPoint;
  allocator_type local_6a;
  equal_to<long_long> local_69;
  value_type local_68;
  hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
  local_58;
  
  if (((this->super_CObject).m_iProp & 1) == 0) {
    for (ppCVar8 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppCVar8 !=
        (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppCVar8 = ppCVar8 + 1) {
      if ((((*ppCVar8)->super_CObject).m_iState & 1) == 0) {
        return;
      }
    }
    SplitWire(this);
    __gnu_cxx::
    hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
    ::hashtable(&local_58,100,(hash<long_long> *)&local_68,&local_69,&local_6a);
    ppCVar8 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar1 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar8 != ppCVar1) {
      do {
        pCVar2 = *ppCVar8;
        local_68.first = (longlong)((uint)(pCVar2->m_pPointS->super_CObject).m_Key & 0xffffff00);
        local_68.second = 0;
        pvVar6 = __gnu_cxx::
                 hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                 ::find_or_insert(&local_58,&local_68);
        pvVar6->second = pvVar6->second + 1;
        local_68.first = (longlong)((uint)(pCVar2->m_pPointE->super_CObject).m_Key & 0xffffff00);
        local_68.second = 0;
        pvVar6 = __gnu_cxx::
                 hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                 ::find_or_insert(&local_58,&local_68);
        pvVar6->second = pvVar6->second + 1;
        ppCVar8 = ppCVar8 + 1;
      } while (ppCVar8 != ppCVar1);
    }
    if (0 < this->m_iNumPin) {
      lVar14 = 0;
      do {
        local_68.first =
             (longlong)
             ((uint)(this->m_ppPin[lVar14]->super_CPoint).super_CObject.m_Key & 0xffffff00);
        __gnu_cxx::
        hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
        ::erase(&local_58,&local_68.first);
        lVar14 = lVar14 + 1;
      } while (lVar14 < this->m_iNumPin);
    }
    if ((long)local_58._M_buckets.
              super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_58._M_buckets.
              super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar14 = (long)local_58._M_buckets.
                     super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_58._M_buckets.
                     super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      lVar12 = 0;
      do {
        if (local_58._M_buckets.
            super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar12] !=
            (_Hashtable_node<std::pair<const_long_long,_int>_> *)0x0) {
          p_Var3 = local_58._M_buckets.
                   super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar12];
          pp_Var9 = local_58._M_buckets.
                    super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pp_Var11 = local_58._M_buckets.
                     super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_00119c25;
        }
        lVar12 = lVar12 + 1;
      } while (lVar14 + (ulong)(lVar14 == 0) != lVar12);
    }
LAB_00119d32:
    iVar5 = this->m_iMinWL;
    iVar4 = GetLength(this,1,1);
    if (iVar5 < iVar4) {
      iVar5 = this->m_iMinWL;
    }
    else {
      iVar5 = GetLength(this,1,1);
    }
    this->m_iMinWL = iVar5;
    if ((this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      __assert_fail("m_Wire.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Net.cpp"
                    ,0x200,"void CNet::Refine()");
    }
    __gnu_cxx::
    hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
    ::~hashtable(&local_58);
  }
  return;
LAB_00119c25:
  while (p_Var7 = p_Var3, (p_Var7->_M_val).second != 1) {
    p_Var3 = p_Var7->_M_next;
    if (p_Var7->_M_next == (_Hashtable_node<std::pair<const_long_long,_int>_> *)0x0) {
      uVar13 = (long)pp_Var11 - (long)pp_Var9 >> 3;
      uVar10 = (ulong)(p_Var7->_M_val).first % uVar13;
      do {
        uVar10 = uVar10 + 1;
        if (uVar13 <= uVar10) goto LAB_00119d32;
        p_Var3 = pp_Var9[uVar10];
      } while (pp_Var9[uVar10] == (_Hashtable_node<std::pair<const_long_long,_int>_> *)0x0);
    }
  }
  ppCVar8 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar1 = (this->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar8 != ppCVar1) {
    uVar10 = (p_Var7->_M_val).first;
    do {
      pCVar2 = *ppCVar8;
      uVar13 = (ulong)((uint)(pCVar2->m_pPointS->super_CObject).m_Key & 0xffffff00);
      uVar15 = (ulong)((uint)(pCVar2->m_pPointE->super_CObject).m_Key & 0xffffff00);
      if ((uVar10 == uVar13) || (uVar10 == uVar15)) {
        DelWire(this,pCVar2,0);
        CWire::Delete(pCVar2);
        local_68.second = 0;
        local_68.first = uVar13;
        pvVar6 = __gnu_cxx::
                 hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                 ::find_or_insert(&local_58,&local_68);
        pvVar6->second = pvVar6->second + -1;
        local_68.second = 0;
        local_68.first = uVar15;
        pvVar6 = __gnu_cxx::
                 hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                 ::find_or_insert(&local_58,&local_68);
        pvVar6->second = pvVar6->second + -1;
        pp_Var9 = local_58._M_buckets.
                  super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pp_Var11 = local_58._M_buckets.
                   super__Vector_base<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*,_std::allocator<__gnu_cxx::_Hashtable_node<std::pair<const_long_long,_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        break;
      }
      ppCVar8 = ppCVar8 + 1;
    } while (ppCVar8 != ppCVar1);
  }
  if ((long)pp_Var11 - (long)pp_Var9 == 0) goto LAB_00119d32;
  lVar14 = (long)pp_Var11 - (long)pp_Var9 >> 3;
  lVar12 = 0;
  while (p_Var3 = pp_Var9[lVar12],
        pp_Var9[lVar12] == (_Hashtable_node<std::pair<const_long_long,_int>_> *)0x0) {
    lVar12 = lVar12 + 1;
    if (lVar14 + (ulong)(lVar14 == 0) == lVar12) goto LAB_00119d32;
  }
  goto LAB_00119c25;
}

Assistant:

void CNet::Refine()
{
	if(IsLocal())	return;
	if(!IsRouted())	return;

	SplitWire();

	hash_map<KEY, int>				RedPoint;
	hash_map<KEY, int>::iterator		itrp;

	vector<CWire*>::iterator itr,end;
	for(itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
	{
		CWire*	pWire	=	*itr;

		++RedPoint[pWire->m_pPointS->GetKey()&0xFFFFFF00];
		++RedPoint[pWire->m_pPointE->GetKey()&0xFFFFFF00];
	}

	for(int i=0;i<GetNumPin();++i)
		RedPoint.erase(GetPin(i)->GetKey()&0xFFFFFF00);

	for(itrp=RedPoint.begin();itrp!=RedPoint.end();)
	{
		if(itrp->second==1)	// dangling point [7/5/2006 thyeros]
		{
			KEY	P	=	itrp->first;
	
			for(itr=m_Wire.begin(),end=m_Wire.end();itr!=end;++itr)
			{
				CWire*	pWire	=	*itr;

				KEY S	=	pWire->m_pPointS->GetKey()&0xFFFFFF00;
				KEY	E	=	pWire->m_pPointE->GetKey()&0xFFFFFF00;

				if(P==S||P==E)
				{
					DelWire(pWire);
					pWire->Delete();//SAFE_DEL(pWire);

					--RedPoint[S];
					--RedPoint[E];

					break;
				}
			}

			itrp=RedPoint.begin();
		}
		else
		{
			++itrp;
		}
	}

	m_iMinWL	=	MIN(m_iMinWL,GetLength(GET_MODE_STATE,STATE_WIRE_ROUTED));
//	m_iMinVia	=	MIN(m_iMinVia,GetNumVia());

	assert(m_Wire.size());
}